

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_ray * rf_get_mouse_ray(rf_ray *__return_storage_ptr__,rf_sizei screen_size,rf_vec2 mouse_position
                         ,rf_camera3d camera)

{
  rf_mat proj;
  rf_mat proj_00;
  rf_mat proj_01;
  rf_mat view;
  rf_mat view_00;
  rf_mat view_01;
  rf_vec3 rVar1;
  rf_vec3 source;
  rf_camera3d rVar2;
  double top_00;
  double right_00;
  rf_vec3 rVar3;
  rf_vec3 rVar4;
  undefined8 local_2a0;
  float local_298;
  rf_vec3 direction;
  float local_230;
  rf_vec3 camera_plane_pointer_pos;
  rf_vec3 far_point;
  undefined4 uStack_1b4;
  float local_1b0;
  rf_vec3 near_point;
  double right;
  double top;
  float aspect;
  undefined8 uStack_e0;
  rf_mat mat_proj;
  undefined1 auStack_70 [8];
  rf_mat mat_view;
  rf_vec3 device_coords;
  float z;
  float y;
  float x;
  rf_vec2 mouse_position_local;
  rf_sizei screen_size_local;
  
  rVar2 = camera;
  (__return_storage_ptr__->position).x = 0.0;
  (__return_storage_ptr__->position).y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->position).z = 0;
  (__return_storage_ptr__->direction).y = 0.0;
  (__return_storage_ptr__->direction).z = 0.0;
  y = mouse_position.x;
  mouse_position_local.x = (float)screen_size.width;
  mat_view.m11 = (y + y) / (float)(int)mouse_position_local.x - 1.0;
  x = mouse_position.y;
  mouse_position_local.y = (float)screen_size.height;
  mat_view.m15 = 1.0 - (x + x) / (float)(int)mouse_position_local.y;
  rVar1 = camera.position;
  rVar3 = camera.target;
  mat_proj.m11 = camera.up.x;
  mat_proj.m15 = camera.up.y;
  rf_mat_look_at((rf_mat *)auStack_70,rVar1,rVar3,rVar2.up);
  rf_mat_identity();
  if (camera.type == RF_CAMERA_PERSPECTIVE) {
    rf_mat_perspective((rf_mat *)&stack0xfffffffffffffee0,(double)(camera.fovy * 0.017453292),
                       (double)(int)mouse_position_local.x / (double)(int)mouse_position_local.y,
                       0.01,1000.0);
    memcpy(&uStack_e0,&stack0xfffffffffffffee0,0x40);
  }
  else if (camera.type == RF_CAMERA_ORTHOGRAPHIC) {
    top_00 = (double)camera.fovy / 2.0;
    right_00 = top_00 * (double)((float)(int)mouse_position_local.x /
                                (float)(int)mouse_position_local.y);
    rf_mat_ortho((rf_mat *)&near_point.z,-right_00,right_00,-top_00,top_00,0.01,1000.0);
    memcpy(&uStack_e0,&near_point.z,0x40);
  }
  source.y = mat_view.m15;
  source.x = mat_view.m11;
  source.z = 0.0;
  proj.m8 = mat_proj.m0;
  proj.m12 = mat_proj.m4;
  proj.m0 = (float)(undefined4)uStack_e0;
  proj.m4 = (float)uStack_e0._4_4_;
  proj.m1 = mat_proj.m8;
  proj.m5 = mat_proj.m12;
  proj.m9 = mat_proj.m1;
  proj.m13 = mat_proj.m5;
  proj.m2 = mat_proj.m9;
  proj.m6 = mat_proj.m13;
  proj.m10 = mat_proj.m2;
  proj.m14 = mat_proj.m6;
  proj.m3 = mat_proj.m10;
  proj.m7 = mat_proj.m14;
  proj.m11 = mat_proj.m3;
  proj.m15 = mat_proj.m7;
  view.m8 = mat_view.m0;
  view.m12 = mat_view.m4;
  view.m0 = (float)auStack_70._0_4_;
  view.m4 = (float)auStack_70._4_4_;
  view.m1 = mat_view.m8;
  view.m5 = mat_view.m12;
  view.m9 = mat_view.m1;
  view.m13 = mat_view.m5;
  view.m2 = mat_view.m9;
  view.m6 = mat_view.m13;
  view.m10 = mat_view.m2;
  view.m14 = mat_view.m6;
  view.m3 = mat_view.m10;
  view.m7 = mat_view.m14;
  view.m11 = mat_view.m3;
  view.m15 = mat_view.m7;
  rVar3 = rf_unproject(source,proj,view);
  local_1b0 = rVar3.z;
  near_point.x = local_1b0;
  stack0xfffffffffffffe48 = rVar3._0_8_;
  rVar4.y = mat_view.m15;
  rVar4.x = mat_view.m11;
  rVar4.z = 1.0;
  proj_00.m8 = mat_proj.m0;
  proj_00.m12 = mat_proj.m4;
  proj_00.m0 = (float)(undefined4)uStack_e0;
  proj_00.m4 = (float)uStack_e0._4_4_;
  proj_00.m1 = mat_proj.m8;
  proj_00.m5 = mat_proj.m12;
  proj_00.m9 = mat_proj.m1;
  proj_00.m13 = mat_proj.m5;
  proj_00.m2 = mat_proj.m9;
  proj_00.m6 = mat_proj.m13;
  proj_00.m10 = mat_proj.m2;
  proj_00.m14 = mat_proj.m6;
  proj_00.m3 = mat_proj.m10;
  proj_00.m7 = mat_proj.m14;
  proj_00.m11 = mat_proj.m3;
  proj_00.m15 = mat_proj.m7;
  view_00.m8 = mat_view.m0;
  view_00.m12 = mat_view.m4;
  view_00.m0 = (float)auStack_70._0_4_;
  view_00.m4 = (float)auStack_70._4_4_;
  view_00.m1 = mat_view.m8;
  view_00.m5 = mat_view.m12;
  view_00.m9 = mat_view.m1;
  view_00.m13 = mat_view.m5;
  view_00.m2 = mat_view.m9;
  view_00.m6 = mat_view.m13;
  view_00.m10 = mat_view.m2;
  view_00.m14 = mat_view.m6;
  view_00.m3 = mat_view.m10;
  view_00.m7 = mat_view.m14;
  view_00.m11 = mat_view.m3;
  view_00.m15 = mat_view.m7;
  rVar4 = rf_unproject(rVar4,proj_00,view_00);
  rVar1.y = mat_view.m15;
  rVar1.x = mat_view.m11;
  rVar1.z = -1.0;
  proj_01.m8 = mat_proj.m0;
  proj_01.m12 = mat_proj.m4;
  proj_01.m0 = (float)(undefined4)uStack_e0;
  proj_01.m4 = (float)uStack_e0._4_4_;
  proj_01.m1 = mat_proj.m8;
  proj_01.m5 = mat_proj.m12;
  proj_01.m9 = mat_proj.m1;
  proj_01.m13 = mat_proj.m5;
  proj_01.m2 = mat_proj.m9;
  proj_01.m6 = mat_proj.m13;
  proj_01.m10 = mat_proj.m2;
  proj_01.m14 = mat_proj.m6;
  proj_01.m3 = mat_proj.m10;
  proj_01.m7 = mat_proj.m14;
  proj_01.m11 = mat_proj.m3;
  proj_01.m15 = mat_proj.m7;
  view_01.m8 = mat_view.m0;
  view_01.m12 = mat_view.m4;
  view_01.m0 = (float)auStack_70._0_4_;
  view_01.m4 = (float)auStack_70._4_4_;
  view_01.m1 = mat_view.m8;
  view_01.m5 = mat_view.m12;
  view_01.m9 = mat_view.m1;
  view_01.m13 = mat_view.m5;
  view_01.m2 = mat_view.m9;
  view_01.m6 = mat_view.m13;
  view_01.m10 = mat_view.m2;
  view_01.m14 = mat_view.m6;
  view_01.m3 = mat_view.m10;
  view_01.m7 = mat_view.m14;
  view_01.m11 = mat_view.m3;
  view_01.m15 = mat_view.m7;
  rVar3 = rf_unproject(rVar1,proj_01,view_01);
  local_230 = rVar3.z;
  direction._4_8_ = rVar3._0_8_;
  rVar3.z = near_point.x;
  rVar3.x = far_point.z;
  rVar3.y = (float)uStack_1b4;
  rVar3 = rf_vec3_sub(rVar4,rVar3);
  rVar3 = rf_vec3_normalize(rVar3);
  local_2a0 = rVar3._0_8_;
  local_298 = rVar3.z;
  if (camera.type == RF_CAMERA_PERSPECTIVE) {
    (__return_storage_ptr__->position).x = camera.position.x;
    (__return_storage_ptr__->position).y = camera.position.y;
    (__return_storage_ptr__->position).z = camera.position.z;
  }
  else if (camera.type == RF_CAMERA_ORTHOGRAPHIC) {
    (__return_storage_ptr__->position).x = direction.y;
    (__return_storage_ptr__->position).y = direction.z;
    (__return_storage_ptr__->position).z = local_230;
  }
  (__return_storage_ptr__->direction).x = (float)(undefined4)local_2a0;
  (__return_storage_ptr__->direction).y = (float)local_2a0._4_4_;
  (__return_storage_ptr__->direction).z = local_298;
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_ray rf_get_mouse_ray(rf_sizei screen_size, rf_vec2 mouse_position, rf_camera3d camera)
{
    rf_ray ray = {0};

    // Calculate normalized device coordinates
    // NOTE: y value is negative
    float x = (2.0f * mouse_position.x) / (float) screen_size.width - 1.0f;
    float y = 1.0f - (2.0f * mouse_position.y) / (float) screen_size.height;
    float z = 1.0f;

    // Store values in a vector
    rf_vec3 device_coords = { x, y, z };

    // Calculate view matrix from camera look at
    rf_mat mat_view = rf_mat_look_at(camera.position, camera.target, camera.up);

    rf_mat mat_proj = rf_mat_identity();

    if (camera.type == RF_CAMERA_PERSPECTIVE)
    {
        // Calculate projection matrix from perspective
        mat_proj = rf_mat_perspective(camera.fovy * RF_DEG2RAD, ((double) screen_size.width / (double) screen_size.height), 0.01, 1000.0);
    }
    else if (camera.type == RF_CAMERA_ORTHOGRAPHIC)
    {
        float aspect = (float) screen_size.width / (float) screen_size.height;
        double top = camera.fovy / 2.0;
        double right = top * aspect;

        // Calculate projection matrix from orthographic
        mat_proj = rf_mat_ortho(-right, right, -top, top, 0.01, 1000.0);
    }

    // Unproject far/near points
    rf_vec3 near_point = rf_unproject((rf_vec3) {device_coords.x, device_coords.y, 0.0f}, mat_proj, mat_view);
    rf_vec3 far_point  = rf_unproject((rf_vec3) {device_coords.x, device_coords.y, 1.0f}, mat_proj, mat_view);

    // Unproject the mouse cursor in the near plane.
    // We need this as the source position because orthographic projects, compared to perspect doesn't have a
    // convergence point, meaning that the "eye" of the camera is more like a plane than a point.
    rf_vec3 camera_plane_pointer_pos = rf_unproject((rf_vec3) {device_coords.x, device_coords.y, -1.0f}, mat_proj,
                                                    mat_view);

    // Calculate normalized direction vector
    rf_vec3 direction = rf_vec3_normalize(rf_vec3_sub(far_point, near_point));

    if (camera.type == RF_CAMERA_PERSPECTIVE)
    {
        ray.position = camera.position;
    }
    else if (camera.type == RF_CAMERA_ORTHOGRAPHIC)
    {
        ray.position = camera_plane_pointer_pos;
    }

    // Apply calculated vectors to ray
    ray.direction = direction;

    return ray;
}